

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O2

string_t duckdb::HugeintCastToVarInt::Operation<duckdb::hugeint_t>
                   (hugeint_t int_value,Vector *result)

{
  byte bVar1;
  bool bVar2;
  idx_t i;
  long lVar3;
  Vector *in_RCX;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t len;
  ulong uVar4;
  char *pcVar5;
  unsigned_long __x;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  unsigned_long uVar10;
  char **ppcVar11;
  __type_conflict6 _Var12;
  double dVar13;
  uhugeint_t int_value_00;
  unsigned_long uStack_60;
  hugeint_t local_58;
  string_t blob;
  hugeint_t local_38;
  
  local_58 = int_value;
  if (int_value.upper < 0) {
    local_38.lower = 0;
    local_38.upper = -0x8000000000000000;
    bVar2 = hugeint_t::operator==(&local_58,&local_38);
    if (bVar2) {
      int_value_00.upper = (uint64_t)result;
      int_value_00.lower = 0x8000000000000000;
      blob = Operation<duckdb::uhugeint_t>((HugeintCastToVarInt *)0x0,int_value_00,in_RCX);
      pcVar5 = blob.value._8_8_;
      if (blob.value._0_4_ < 0xd) {
        pcVar5 = blob.value.pointer.prefix;
      }
      Varint::SetHeader(pcVar5,(ulong)blob.value._0_4_ - 3,true);
      for (uVar9 = 3; uVar9 < blob.value.pointer.length; uVar9 = uVar9 + 1) {
        pcVar5[uVar9] = ~pcVar5[uVar9];
      }
      goto LAB_013bc267;
    }
    local_58 = hugeint_t::operator-(&local_58);
    if (local_58.upper != -1) goto LAB_013bc0ce;
    uStack_60 = 0xffffffffffffffff;
    uVar10 = uStack_60;
LAB_013bc0db:
    _Var12 = ::std::log2<unsigned_long>(uStack_60);
    dVar13 = ceil(_Var12 * 0.125);
    uVar9 = (ulong)dVar13;
    if ((int)uVar9 == 0) {
      goto LAB_013bc179;
    }
    iVar6 = (int)uVar9 + 8;
    len = extraout_RDX;
  }
  else {
LAB_013bc0ce:
    uVar10 = local_58.upper;
    if (uVar10 != 0) {
      uStack_60 = uVar10 + 1;
      goto LAB_013bc0db;
    }
    uVar10 = 0;
LAB_013bc179:
    if (local_58.lower == 0xffffffffffffffff) {
      __x = 0xffffffffffffffff;
    }
    else {
      __x = local_58.lower + 1;
    }
    _Var12 = ::std::log2<unsigned_long>(__x);
    dVar13 = ceil(_Var12 * 0.125);
    iVar6 = (int)(long)dVar13;
    uVar9 = 0;
    len = extraout_RDX_00;
  }
  uVar7 = iVar6 + (uint)(iVar6 == 0);
  blob = StringVector::EmptyString((StringVector *)result,(Vector *)(ulong)(uVar7 + 3),len);
  pcVar5 = blob.value._8_8_;
  if (blob.value._0_4_ < 0xd) {
    pcVar5 = blob.value.pointer.prefix;
  }
  Varint::SetHeader(pcVar5,(ulong)uVar7,(bool)(int_value.upper._7_1_ >> 7));
  ppcVar11 = (char **)(pcVar5 + 3);
  lVar3 = (uVar9 & 0xffffffff) * 8;
  uVar4 = uVar9 & 0xffffffff;
  while( true ) {
    lVar3 = lVar3 + -8;
    bVar1 = (char)int_value.upper._7_1_ >> 7;
    if ((int)uVar4 < 1) break;
    *(byte *)ppcVar11 = (byte)(uVar10 >> ((byte)lVar3 & 0x3f)) ^ bVar1;
    ppcVar11 = (char **)((long)ppcVar11 + 1);
    uVar4 = (ulong)((int)uVar4 - 1);
  }
  iVar8 = uVar7 + ~(uint)uVar9;
  iVar6 = iVar8 * 8;
  for (; -1 < iVar8; iVar8 = iVar8 + -1) {
    *(byte *)ppcVar11 = (byte)(local_58.lower >> ((byte)iVar6 & 0x3f)) ^ bVar1;
    ppcVar11 = (char **)((long)ppcVar11 + 1);
    iVar6 = iVar6 + -8;
  }
LAB_013bc267:
  string_t::Finalize(&blob);
  return (string_t)blob.value;
}

Assistant:

string_t HugeintCastToVarInt::Operation(hugeint_t int_value, Vector &result) {
	// Determine if the number is negative
	bool is_negative = int_value.upper >> 63 & 1;
	if (is_negative) {
		// We must check if it's -170141183460469231731687303715884105728, since it's not possible to negate it
		// without overflowing
		if (int_value == NumericLimits<hugeint_t>::Minimum()) {
			uhugeint_t u_int_value {0x8000000000000000, 0};
			auto cast_value = Operation<uhugeint_t>(u_int_value, result);
			// We have to do all the bit flipping.
			auto writable_value_ptr = cast_value.GetDataWriteable();
			Varint::SetHeader(writable_value_ptr, cast_value.GetSize() - Varint::VARINT_HEADER_SIZE, is_negative);
			for (idx_t i = Varint::VARINT_HEADER_SIZE; i < cast_value.GetSize(); i++) {
				writable_value_ptr[i] = static_cast<char>(~writable_value_ptr[i]);
			}
			cast_value.Finalize();
			return cast_value;
		}
		int_value = -int_value;
	}
	// Determine the number of data bytes
	uint64_t abs_value_upper = static_cast<uint64_t>(int_value.upper);

	uint32_t data_byte_size;
	if (abs_value_upper != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size =
		    (abs_value_upper == 0) ? 0 : static_cast<uint32_t>(std::ceil(std::log2(abs_value_upper + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value_upper) / 8.0));
	}

	uint32_t upper_byte_size = data_byte_size;
	if (data_byte_size > 0) {
		// If we have at least one byte on the upper side, the bottom side is complete
		data_byte_size += 8;
	} else {
		if (int_value.lower != NumericLimits<uint64_t>::Maximum()) {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower + 1) / 8.0));
		} else {
			data_byte_size += static_cast<uint32_t>(std::ceil(std::log2(int_value.lower) / 8.0));
		}
	}

	if (data_byte_size == 0) {
		data_byte_size++;
	}
	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(upper_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value_upper >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value_upper >> i * 8 & 0xFF);
		}
	}
	for (int i = static_cast<int>(data_byte_size - upper_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(int_value.lower >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(int_value.lower >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}